

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeDeclaration_Typedef.cpp
# Opt level: O0

void __thiscall
psy::C::TypedefDeclarationSymbol::TypedefDeclarationSymbol
          (TypedefDeclarationSymbol *this,Symbol *containingSym,SyntaxTree *tree,
          Scope *enclosingScope,TypedefNameType *tydefNameTy)

{
  TypeDeclarationImpl *this_00;
  TypedefNameType *tydefNameTy_local;
  Scope *enclosingScope_local;
  SyntaxTree *tree_local;
  Symbol *containingSym_local;
  TypedefDeclarationSymbol *this_local;
  
  this_00 = (TypeDeclarationImpl *)operator_new(0x30);
  TypeDeclarationSymbol::TypeDeclarationImpl::TypeDeclarationImpl
            (this_00,TypedefDeclaration,containingSym,tree,enclosingScope,OrdinaryIdentifiers,
             &tydefNameTy->super_Type);
  TypeDeclarationSymbol::TypeDeclarationSymbol(&this->super_TypeDeclarationSymbol,this_00);
  (this->super_TypeDeclarationSymbol).super_DeclarationSymbol.super_Symbol._vptr_Symbol =
       (_func_int **)&PTR__TypedefDeclarationSymbol_007342c8;
  this->synonymizedTy_ = (Type *)0x0;
  TypedefNameType::setDeclaration(tydefNameTy,this);
  return;
}

Assistant:

TypedefDeclarationSymbol::TypedefDeclarationSymbol(const Symbol* containingSym,
                 const SyntaxTree* tree,
                 const Scope* enclosingScope,
                 TypedefNameType* tydefNameTy)
    : TypeDeclarationSymbol(
          new TypeDeclarationImpl(SymbolKind::TypedefDeclaration,
                                  containingSym,
                                  tree,
                                  enclosingScope,
                                  NameSpace::OrdinaryIdentifiers,
                                  tydefNameTy))
    , synonymizedTy_(nullptr)
{
    tydefNameTy->setDeclaration(this);
}